

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream * QtPrivate::writeSequentialContainer<QList<QString>>(QDataStream *s,QList<QString> *c)

{
  ulong uVar1;
  QDataStream *this;
  int iVar2;
  value_type *t;
  QString *pQVar3;
  long lVar4;
  
  uVar1 = (c->d).size;
  if (uVar1 >> 1 < 0x7fffffff) {
    iVar2 = (int)uVar1;
  }
  else {
    if (0x15 < *(int *)(s + 0x18)) {
      this = (QDataStream *)QDataStream::operator<<(s,-2);
      QDataStream::operator<<(this,uVar1);
      goto LAB_004f21d8;
    }
    if (uVar1 != 0xfffffffe) {
      QDataStream::setStatus((Status)s);
      return s;
    }
    iVar2 = -2;
  }
  QDataStream::operator<<(s,iVar2);
LAB_004f21d8:
  lVar4 = (c->d).size;
  if (lVar4 != 0) {
    pQVar3 = (c->d).ptr;
    lVar4 = lVar4 * 0x18;
    do {
      ::operator<<(s,(QString *)pQVar3);
      pQVar3 = pQVar3 + 1;
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}